

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_resize.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::ListResizeBind
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  vector<duckdb::LogicalType,_true> *this_00;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var1;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var2;
  bool bVar3;
  reference pvVar4;
  reference pvVar5;
  pointer pEVar6;
  LogicalType *pLVar7;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_50;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_38;
  
  LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffffb0,UBIGINT);
  this_00 = &(bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments;
  pvVar4 = vector<duckdb::LogicalType,_true>::get<true>(this_00,1);
  LogicalType::operator=(pvVar4,(LogicalType *)&stack0xffffffffffffffb0);
  LogicalType::~LogicalType((LogicalType *)&stack0xffffffffffffffb0);
  pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(arguments,0);
  local_38._M_head_impl =
       (pvVar5->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
       .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (pvVar5->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
  BoundCastExpression::AddArrayCastToList
            ((BoundCastExpression *)&stack0xffffffffffffffb0,context,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &stack0xffffffffffffffc8);
  pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(arguments,0);
  _Var2._M_head_impl = local_50._M_head_impl;
  local_50._M_head_impl = (Expression *)0x0;
  _Var1._M_head_impl =
       (pvVar5->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
       .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (pvVar5->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = _Var2._M_head_impl;
  if (_Var1._M_head_impl != (Expression *)0x0) {
    (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BaseExpression + 8))();
  }
  if (local_50._M_head_impl != (Expression *)0x0) {
    (**(code **)(*(_func_int **)local_50._M_head_impl + 8))();
  }
  local_50._M_head_impl = (Expression *)0x0;
  if ((_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
      local_38._M_head_impl != (Expression *)0x0) {
    (*(*(_func_int ***)local_38._M_head_impl)[1])();
  }
  local_38._M_head_impl = (Expression *)0x0;
  pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(arguments,0);
  pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar5);
  LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffffb0,SQLNULL);
  bVar3 = LogicalType::operator==(&pEVar6->return_type,(LogicalType *)&stack0xffffffffffffffb0);
  LogicalType::~LogicalType((LogicalType *)&stack0xffffffffffffffb0);
  if (bVar3) {
    LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffffb0,SQLNULL);
    pvVar4 = vector<duckdb::LogicalType,_true>::get<true>(this_00,0);
    LogicalType::operator=(pvVar4,(LogicalType *)&stack0xffffffffffffffb0);
    LogicalType::~LogicalType((LogicalType *)&stack0xffffffffffffffb0);
    LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffffb0,SQLNULL);
    LogicalType::operator=
              (&(bound_function->super_BaseScalarFunction).return_type,
               (LogicalType *)&stack0xffffffffffffffb0);
    LogicalType::~LogicalType((LogicalType *)&stack0xffffffffffffffb0);
  }
  else {
    pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>(arguments,0);
    pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar5);
    LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffffb0,UNKNOWN);
    bVar3 = LogicalType::operator==(&pEVar6->return_type,(LogicalType *)&stack0xffffffffffffffb0);
    LogicalType::~LogicalType((LogicalType *)&stack0xffffffffffffffb0);
    if ((!bVar3) &&
       ((long)(bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments.
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments.
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_start == 0x48)) {
      pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::get<true>(arguments,0);
      pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar5);
      pLVar7 = ListType::GetChildType(&pEVar6->return_type);
      pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::get<true>(arguments,2);
      pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar5);
      bVar3 = LogicalType::operator!=(pLVar7,&pEVar6->return_type);
      if (bVar3) {
        pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::get<true>(arguments,2);
        pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(pvVar5);
        LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffffb0,SQLNULL);
        bVar3 = LogicalType::operator!=
                          (&pEVar6->return_type,(LogicalType *)&stack0xffffffffffffffb0);
        LogicalType::~LogicalType((LogicalType *)&stack0xffffffffffffffb0);
        if (bVar3) {
          pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                   ::get<true>(arguments,0);
          pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                   operator->(pvVar5);
          pLVar7 = ListType::GetChildType(&pEVar6->return_type);
          pvVar4 = vector<duckdb::LogicalType,_true>::get<true>(this_00,2);
          LogicalType::operator=(pvVar4,pLVar7);
        }
      }
    }
    pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>(arguments,0);
    pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar5);
    LogicalType::operator=
              (&(bound_function->super_BaseScalarFunction).return_type,&pEVar6->return_type);
  }
  make_uniq<duckdb::VariableReturnBindData,duckdb::LogicalType&>
            ((duckdb *)&stack0xffffffffffffffb0,
             &(bound_function->super_BaseScalarFunction).return_type);
  *(Expression **)this = local_50._M_head_impl;
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

static unique_ptr<FunctionData> ListResizeBind(ClientContext &context, ScalarFunction &bound_function,
                                               vector<unique_ptr<Expression>> &arguments) {
	D_ASSERT(bound_function.arguments.size() == 2 || arguments.size() == 3);
	bound_function.arguments[1] = LogicalType::UBIGINT;

	// If the first argument is an array, cast it to a list.
	arguments[0] = BoundCastExpression::AddArrayCastToList(context, std::move(arguments[0]));

	// Early-out, if the first argument is a constant NULL.
	if (arguments[0]->return_type == LogicalType::SQLNULL) {
		bound_function.arguments[0] = LogicalType::SQLNULL;
		bound_function.return_type = LogicalType::SQLNULL;
		return make_uniq<VariableReturnBindData>(bound_function.return_type);
	}

	// Early-out, if the first argument is a prepared statement.
	if (arguments[0]->return_type == LogicalType::UNKNOWN) {
		bound_function.return_type = arguments[0]->return_type;
		return make_uniq<VariableReturnBindData>(bound_function.return_type);
	}

	// Attempt implicit casting, if the default type does not match list the list child type.
	if (bound_function.arguments.size() == 3 &&
	    ListType::GetChildType(arguments[0]->return_type) != arguments[2]->return_type &&
	    arguments[2]->return_type != LogicalTypeId::SQLNULL) {
		bound_function.arguments[2] = ListType::GetChildType(arguments[0]->return_type);
	}

	bound_function.return_type = arguments[0]->return_type;
	return make_uniq<VariableReturnBindData>(bound_function.return_type);
}